

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  u32 uVar1;
  u32 *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  u32 *page0;
  i64 nSize;
  u32 pgno;
  u8 aBuf [32];
  u8 *local_b8;
  u32 local_b0;
  u32 *local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  u32 local_70;
  u32 local_6c;
  undefined4 local_68;
  uint local_64;
  undefined4 local_60;
  uint local_5c;
  undefined8 local_58;
  uint local_50;
  uint local_4c;
  u8 *local_40;
  ulong local_38;
  
  if (pWal->nWiData < 1) {
LAB_0014b8c0:
    iVar4 = walIndexPageRealloc(pWal,0,&local_a0);
  }
  else {
    local_a0 = *pWal->apWiData;
    iVar4 = 0;
    if (local_a0 == (u32 *)0x0) goto LAB_0014b8c0;
  }
  if (iVar4 != 0) {
    if (iVar4 != 0x508) {
      return iVar4;
    }
    pWal->bShmUnreliable = '\x01';
    pWal->exclusiveMode = '\x02';
    *pChanged = 1;
  }
  if ((local_a0 != (u32 *)0x0) && (iVar5 = walIndexTryHdr(pWal,pChanged), iVar5 == 0)) {
    bVar3 = true;
    goto LAB_0014bc5b;
  }
  if ((pWal->bShmUnreliable == '\0') && ((pWal->readOnly & 2) != 0)) {
    iVar4 = 0;
    if (pWal->exclusiveMode == '\0') {
      iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,6);
    }
    if (iVar4 != 0) {
LAB_0014b941:
      bVar3 = false;
      goto LAB_0014bc5b;
    }
    iVar4 = 0x108;
    bVar3 = false;
    if (pWal->exclusiveMode != '\0') goto LAB_0014bc5b;
    iVar5 = 5;
    bVar3 = false;
  }
  else {
    iVar4 = 0;
    if (pWal->exclusiveMode == '\0') {
      iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10);
    }
    if (iVar4 != 0) goto LAB_0014b941;
    pWal->writeLock = '\x01';
    if (pWal->nWiData < 1) {
LAB_0014b96e:
      iVar4 = walIndexPageRealloc(pWal,0,&local_a0);
    }
    else {
      local_a0 = *pWal->apWiData;
      iVar4 = 0;
      if (local_a0 == (u32 *)0x0) goto LAB_0014b96e;
    }
    bVar3 = false;
    if (iVar4 == 0) {
      iVar4 = walIndexTryHdr(pWal,pChanged);
      if (iVar4 == 0) {
        bVar3 = true;
        iVar4 = 0;
      }
      else {
        iVar12 = 2 - (uint)pWal->ckptLock;
        iVar5 = pWal->ckptLock + 1;
        iVar4 = 0;
        if (pWal->exclusiveMode == '\0') {
          iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar5,iVar12,10);
        }
        if (iVar4 == 0) {
          iVar6 = 0;
          if (pWal->exclusiveMode == '\0') {
            iVar6 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
          }
          iVar4 = 0;
          if ((iVar6 != 0) && (iVar4 = iVar6, pWal->exclusiveMode == '\0')) {
            (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar5,iVar12,9);
          }
        }
        if (iVar4 == 0) {
          (pWal->hdr).aSalt[0] = 0;
          (pWal->hdr).aSalt[1] = 0;
          (pWal->hdr).aCksum[0] = 0;
          (pWal->hdr).aCksum[1] = 0;
          (pWal->hdr).mxFrame = 0;
          (pWal->hdr).nPage = 0;
          (pWal->hdr).aFrameCksum[0] = 0;
          (pWal->hdr).aFrameCksum[1] = 0;
          (pWal->hdr).iVersion = 0;
          (pWal->hdr).unused = 0;
          (pWal->hdr).iChange = 0;
          (pWal->hdr).isInit = '\0';
          (pWal->hdr).bigEndCksum = '\0';
          (pWal->hdr).szPage = 0;
          iVar4 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&local_78);
          if (iVar4 == 0) {
            iVar4 = 0;
            if (0x20 < local_78) {
              iVar4 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,&local_68,0x20,0);
              if (iVar4 == 0) {
                lVar8 = 3;
                if ((local_68._3_1_ & 0xfffffffe |
                    (local_68 >> 0x10 & 0xff) << 8 |
                    (local_68 >> 8 & 0xff) << 0x10 | local_68 << 0x18) != 0x377f0682)
                goto LAB_0014bb75;
                iVar4 = (local_60 >> 8 & 0xff) * 0x10000;
                uVar9 = iVar4 + local_60 * 0x1000000;
                uVar11 = (local_60 >> 0x10 & 0xff) << 8;
                uVar10 = uVar9 + local_60._3_1_ | uVar11;
                if (uVar10 - 0x10001 < 0xffff01ff || (uVar10 & uVar10 - 1) != 0) goto LAB_0014bb75;
                local_90 = CONCAT44(local_90._4_4_,uVar11);
                (pWal->hdr).bigEndCksum = (u8)(local_68._3_1_ & 1);
                pWal->szPage = uVar10;
                pWal->nCkpt = local_5c >> 0x18 | (local_5c & 0xff0000) >> 8 |
                              (local_5c & 0xff00) << 8 | local_5c << 0x18;
                *(undefined8 *)(pWal->hdr).aSalt = local_58;
                local_88 = (ulong)uVar9;
                local_80 = (ulong)(local_60 * 0x1000000);
                local_38 = (ulong)local_60._3_1_;
                walChecksumBytes(local_68._3_1_ & 1 ^ 1,(u8 *)&local_68,0x18,(u32 *)0x0,
                                 (pWal->hdr).aFrameCksum);
                if ((pWal->hdr).aFrameCksum[0] !=
                    (local_50 >> 0x18 | (local_50 & 0xff0000) >> 8 | (local_50 & 0xff00) << 8 |
                    local_50 << 0x18)) {
                  lVar8 = 3;
                  goto LAB_0014bb75;
                }
                lVar8 = 3;
                if ((pWal->hdr).aFrameCksum[1] !=
                    (local_4c >> 0x18 | (local_4c & 0xff0000) >> 8 | (local_4c & 0xff00) << 8 |
                    local_4c << 0x18)) goto LAB_0014bb75;
                if ((local_64 >> 0x18 | (local_64 & 0xff0000) >> 8 | (local_64 & 0xff00) << 8 |
                    local_64 << 0x18) != 0x2de218) {
                  iVar4 = 0xe;
                  sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xe893,
                              "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
                  goto LAB_0014bb87;
                }
                uVar10 = uVar10 + 0x18;
                iVar5 = sqlite3_initialize();
                if (iVar5 == 0) {
                  local_b8 = (u8 *)sqlite3Malloc((ulong)uVar10);
                }
                else {
                  local_b8 = (u8 *)0x0;
                }
                if (local_b8 != (u8 *)0x0) {
                  local_98 = 0;
                  if ((long)((ulong)uVar10 + 0x20) <= local_78) {
                    local_40 = local_b8 + 0x18;
                    local_88 = (ulong)((uint)(local_88 >> 0x10) & 0xffff | (uint)local_90);
                    local_90 = (ulong)((int)local_80 + iVar4 + (uint)local_90 + (int)local_38 + 0x18
                                      );
                    uVar7 = 0x20;
                    local_b0 = 1;
                    local_98 = 0;
                    do {
                      local_80 = uVar7;
                      iVar4 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,local_b8,uVar10,uVar7);
                      if (iVar4 == 0) {
                        iVar4 = walDecodeFrame(pWal,&local_6c,&local_70,local_40,local_b8);
                        if (iVar4 == 0) {
                          bVar3 = false;
                        }
                        else {
                          iVar4 = walIndexAppend(pWal,local_b0,local_6c);
                          if (iVar4 != 0) goto LAB_0014bec1;
                          bVar3 = true;
                          if (local_70 != 0) {
                            (pWal->hdr).mxFrame = local_b0;
                            (pWal->hdr).nPage = local_70;
                            (pWal->hdr).szPage = (u16)local_88;
                            local_98 = (ulong)(pWal->hdr).aFrameCksum[1];
                          }
                        }
                      }
                      else {
LAB_0014bec1:
                        bVar3 = false;
                      }
                      if (!bVar3) break;
                      uVar7 = local_80 + local_90;
                      local_b0 = local_b0 + 1;
                    } while ((long)(local_90 + uVar7) <= local_78);
                  }
                  sqlite3_free(local_b8);
                  lVar8 = 0;
                  goto LAB_0014bb75;
                }
              }
              lVar8 = 2;
LAB_0014bb75:
              iVar4 = (*(code *)((long)&DAT_001fdd8c + (long)(int)(&DAT_001fdd8c)[lVar8]))();
              return iVar4;
            }
LAB_0014bb87:
            if (iVar4 == 0) {
              (pWal->hdr).aFrameCksum[0] = 0;
              (pWal->hdr).aFrameCksum[1] = 0;
              walIndexWriteHdr(pWal);
              puVar2 = *pWal->apWiData;
              lVar8 = 0;
              puVar2[0x18] = 0;
              puVar2[0x20] = (pWal->hdr).mxFrame;
              puVar2[0x19] = 0;
              do {
                puVar2[lVar8 + 0x1a] = 0xffffffff;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 4);
              uVar1 = (pWal->hdr).mxFrame;
              if (uVar1 != 0) {
                puVar2[0x1a] = uVar1;
              }
              if ((pWal->hdr).nPage == 0) {
                iVar4 = 0;
              }
              else {
                iVar4 = 0;
                sqlite3_log(0x11b,"recovered %d frames from WAL file %s",(ulong)(pWal->hdr).mxFrame,
                            pWal->zWalName);
              }
            }
          }
          if (pWal->exclusiveMode == '\0') {
            (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar5,iVar12,9);
          }
          if (pWal->exclusiveMode == '\0') {
            (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
          }
        }
        *pChanged = 1;
        bVar3 = false;
      }
    }
    pWal->writeLock = '\0';
    if (pWal->exclusiveMode != '\0') goto LAB_0014bc5b;
    iVar5 = 9;
  }
  (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,iVar5);
LAB_0014bc5b:
  if ((bVar3) && ((pWal->hdr).iVersion != 0x2de218)) {
    iVar4 = 0xe;
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xec65,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  }
  if (pWal->bShmUnreliable != '\0') {
    if (iVar4 == 0) {
      iVar4 = 0;
    }
    else {
      walIndexClose(pWal,0);
      pWal->bShmUnreliable = '\0';
      if (iVar4 == 0x20a) {
        iVar4 = -1;
      }
    }
    pWal->exclusiveMode = '\0';
  }
  return iVar4;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the 
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    assert( rc!=SQLITE_READONLY ); /* READONLY changed to OK in walIndexPage */
    if( rc==SQLITE_READONLY_CANTINIT ){
      /* The SQLITE_READONLY_CANTINIT return means that the shared-memory
      ** was openable but is not writable, and this thread is unable to
      ** confirm that another write-capable connection has the shared-memory
      ** open, and hence the content of the shared-memory is unreliable,
      ** since the shared-memory might be inconsistent with the WAL file
      ** and there is no writer on hand to fix it. */
      assert( page0==0 );
      assert( pWal->writeLock==0 );
      assert( pWal->readOnly & WAL_SHM_RDONLY );
      pWal->bShmUnreliable = 1;
      pWal->exclusiveMode = WAL_HEAPMEMORY_MODE;
      *pChanged = 1;
    }else{
      return rc; /* Any other non-OK return is just an error */
    }
  }else{
    /* page0 can be NULL if the SHM is zero bytes in size and pWal->writeLock
    ** is zero, which prevents the SHM from growing */
    testcase( page0!=0 );
  }
  assert( page0!=0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently 
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  assert( badHdr==0 || pWal->writeLock==0 );
  if( badHdr ){
    if( pWal->bShmUnreliable==0 && (pWal->readOnly & WAL_SHM_RDONLY) ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else if( SQLITE_OK==(rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1)) ){
      pWal->writeLock = 1;
      if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
        badHdr = walIndexTryHdr(pWal, pChanged);
        if( badHdr ){
          /* If the wal-index header is still malformed even while holding
          ** a WRITE lock, it can only mean that the header is corrupted and
          ** needs to be reconstructed.  So run recovery to do exactly that.
          */
          rc = walIndexRecover(pWal);
          *pChanged = 1;
        }
      }
      pWal->writeLock = 0;
      walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }
  if( pWal->bShmUnreliable ){
    if( rc!=SQLITE_OK ){
      walIndexClose(pWal, 0);
      pWal->bShmUnreliable = 0;
      assert( pWal->nWiData>0 && pWal->apWiData[0]==0 );
      /* walIndexRecover() might have returned SHORT_READ if a concurrent
      ** writer truncated the WAL out from under it.  If that happens, it
      ** indicates that a writer has fixed the SHM file for us, so retry */
      if( rc==SQLITE_IOERR_SHORT_READ ) rc = WAL_RETRY;
    }
    pWal->exclusiveMode = WAL_NORMAL_MODE;
  }

  return rc;
}